

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O0

void * __thiscall axl::sys::TlsMgr::setSlotValue(TlsMgr *this,size_t slot,TlsValue *value)

{
  void *pvVar1;
  BoxListEntry<axl::rc::Ptr<void>_> **ppBVar2;
  BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *__filename;
  Entry *pEVar3;
  Ptr *in_RDX;
  ulong in_RSI;
  void *prev;
  BoxListEntry<axl::rc::Ptr<void>_> *entry;
  size_t count;
  Page *page;
  BoxListEntry<axl::rc::Ptr<void>_> *in_stack_ffffffffffffff78;
  Ptr<void> *in_stack_ffffffffffffff80;
  Rwi local_70;
  IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
  in_stack_ffffffffffffff98;
  Rwi in_stack_ffffffffffffffa0;
  BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *in_stack_ffffffffffffffa8;
  BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> local_50;
  BoxListEntry<axl::rc::Ptr<void>_> *local_38;
  size_t local_30;
  Page *local_28;
  Ptr *local_20;
  ulong local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = getCurrentThreadPage((TlsMgr *)in_stack_ffffffffffffff98.m_p);
  local_30 = sl::
             ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
             ::getCount((ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                         *)local_28);
  if (local_30 <= local_18) {
    pvVar1 = rc::Ptr::operator_cast_to_void_(local_20);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    sl::
    Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
    ::setCountZeroConstruct
              ((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  }
  ppBVar2 = sl::
            Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
            ::operator[]((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                          *)in_stack_ffffffffffffff80,(intptr_t)in_stack_ffffffffffffff78);
  local_38 = *ppBVar2;
  local_50.
  super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
  .
  super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
  .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_count = 0;
  if (local_38 == (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
    pvVar1 = rc::Ptr::operator_cast_to_void_(local_20);
    if (pvVar1 != (void *)0x0) {
      sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::insertTail
                (in_stack_ffffffffffffffa8,(Ptr<void> *)in_stack_ffffffffffffffa0.m_p);
      pEVar3 = sl::
               IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
               ::getEntry((IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
                           *)&stack0xffffffffffffff98);
      local_38 = pEVar3;
      local_70 = sl::
                 Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                 ::rwi((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                        *)in_stack_ffffffffffffff78);
      ppBVar2 = sl::
                Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                ::Rwi::operator[](&local_70,local_18);
      *ppBVar2 = pEVar3;
    }
  }
  else {
    local_50.
    super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
    .
    super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
    .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_count =
         (size_t)rc::Ptr::operator_cast_to_void_((Ptr *)&local_38->m_value);
    pvVar1 = rc::Ptr::operator_cast_to_void_(local_20);
    if (pvVar1 == (void *)0x0) {
      __filename = &local_28->m_valueList;
      sl::BoxIterator<axl::rc::Ptr<void>_>::BoxIterator
                ((BoxIterator<axl::rc::Ptr<void>_> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::remove
                (&local_50,(char *)__filename);
      rc::Ptr<void>::~Ptr((Ptr<void> *)0x13e9c3);
      sl::
      Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
      ::rwi((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
             *)in_stack_ffffffffffffff78);
      ppBVar2 = sl::
                Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                ::Rwi::operator[]((Rwi *)&stack0xffffffffffffffa0,local_18);
      *ppBVar2 = (BoxListEntry<axl::rc::Ptr<void>_> *)0x0;
    }
    else {
      rc::Ptr<void>::operator=(in_stack_ffffffffffffff80,(Ptr<void> *)in_stack_ffffffffffffff78);
    }
  }
  return (void *)local_50.
                 super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
                 .
                 super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
                 .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_count;
}

Assistant:

void*
TlsMgr::setSlotValue(
	size_t slot,
	const TlsValue& value
) {
	Page* page = getCurrentThreadPage();

	size_t count = page->m_array.getCount();
	if (slot >= count) {
		if (!value)
			return NULL;

		page->m_array.setCountZeroConstruct(slot + 1);
	}

	sl::BoxListEntry<TlsValue>* entry = page->m_array[slot];

	void* prev = NULL;

	if (entry) {
		prev = entry->m_value;

		if (value) {
			entry->m_value = value;
		} else {
			page->m_valueList.remove(entry);
			page->m_array.rwi()[slot] = NULL;
		}
	} else if (value) {
		entry = page->m_valueList.insertTail(value).getEntry();
		page->m_array.rwi()[slot] = entry;
	}

	return prev;
}